

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImVector_ImVec4 * ImVector_ImVec4_ImVector_ImVec4Vector(ImVector_ImVec4 *src)

{
  ImVector<ImVec4> *this;
  
  this = (ImVector<ImVec4> *)ImGui::MemAlloc(0x10);
  ImVector<ImVec4>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImVec4* ImVector_ImVec4_ImVector_ImVec4Vector(const ImVector_ImVec4 src)
{
    return IM_NEW(ImVector_ImVec4)(src);
}